

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

string * anon_unknown.dwarf_b38497::TargetId
                   (string *__return_storage_ptr__,cmGeneratorTarget *gt,string *topBuild)

{
  cmLocalGenerator *this;
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string hash;
  undefined1 local_50 [8];
  string path;
  cmCryptoHash hasher;
  string *topBuild_local;
  cmGeneratorTarget *gt_local;
  
  cmCryptoHash::cmCryptoHash((cmCryptoHash *)((long)&path.field_2 + 8),AlgoSHA3_256);
  this = cmGeneratorTarget::GetLocalGenerator(gt);
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this);
  RelativeIfUnder((string *)local_50,topBuild,psVar1);
  cmCryptoHash::HashString
            ((string *)local_80,(cmCryptoHash *)((long)&path.field_2 + 8),(string *)local_50);
  std::__cxx11::string::resize((ulong)local_80,'\x14');
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
  std::operator+(&local_a0,psVar1,"::@");
  std::operator+(__return_storage_ptr__,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_50);
  cmCryptoHash::~cmCryptoHash((cmCryptoHash *)((long)&path.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string TargetId(cmGeneratorTarget const* gt, std::string const& topBuild)
{
  cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_256);
  std::string path = RelativeIfUnder(
    topBuild, gt->GetLocalGenerator()->GetCurrentBinaryDirectory());
  std::string hash = hasher.HashString(path);
  hash.resize(20, '0');
  return gt->GetName() + CMAKE_DIRECTORY_ID_SEP + hash;
}